

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O0

DynamicObject * __thiscall
JsrtDebuggerObjectGlobalsNode::GetJSONObject
          (JsrtDebuggerObjectGlobalsNode *this,ScriptContext *scriptContext,bool forceSetValueProp)

{
  uint value;
  JavascriptLibrary *this_00;
  DynamicObject *object;
  JsrtDebugPropertyId local_34;
  DynamicObject *local_30;
  DynamicObject *globalsNode;
  IDiagObjectModelDisplay *objectDisplayRef;
  ScriptContext *pSStack_18;
  bool forceSetValueProp_local;
  ScriptContext *scriptContext_local;
  JsrtDebuggerObjectGlobalsNode *this_local;
  
  objectDisplayRef._7_1_ = forceSetValueProp;
  pSStack_18 = scriptContext;
  scriptContext_local = (ScriptContext *)this;
  globalsNode = (DynamicObject *)
                Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::GetStrongReference
                          (this->objectDisplay);
  local_30 = (DynamicObject *)0x0;
  if (globalsNode != (DynamicObject *)0x0) {
    this_00 = Js::ScriptContext::GetLibrary(pSStack_18);
    object = Js::JavascriptLibrary::CreateObject(this_00,false,0);
    local_30 = object;
    JsrtDebugPropertyId::JsrtDebugPropertyId(&local_34,handle);
    value = JsrtDebuggerObjectBase::GetHandle(&this->super_JsrtDebuggerObjectBase);
    JsrtDebugUtils::AddPropertyToObject(object,local_34,value,pSStack_18);
    Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::ReleaseStrongReference
              (this->objectDisplay);
  }
  return local_30;
}

Assistant:

Js::DynamicObject * JsrtDebuggerObjectGlobalsNode::GetJSONObject(Js::ScriptContext * scriptContext, bool forceSetValueProp)
{
    Js::IDiagObjectModelDisplay* objectDisplayRef = this->objectDisplay->GetStrongReference();

    Js::DynamicObject* globalsNode = nullptr;

    if (objectDisplayRef != nullptr)
    {
        globalsNode = scriptContext->GetLibrary()->CreateObject();
        JsrtDebugUtils::AddPropertyToObject(globalsNode, JsrtDebugPropertyId::handle, this->GetHandle(), scriptContext);
        this->objectDisplay->ReleaseStrongReference();
    }

    return globalsNode;
}